

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
merlin::convert_index::convert_index
          (convert_index *this,vector<merlin::variable,_std::allocator<merlin::variable>_> *order,
          bool source_big_endian,bool target_big_endian)

{
  const_iterator ci;
  bool bVar1;
  size_type sVar2;
  const_iterator B;
  variable vVar3;
  variable local_c8;
  const_iterator local_b8;
  undefined1 local_98 [8];
  const_iterator i;
  undefined1 local_68 [8];
  variable_set _vs;
  bool target_big_endian_local;
  bool source_big_endian_local;
  vector<merlin::variable,_std::allocator<merlin::variable>_> *order_local;
  convert_index *this_local;
  
  std::vector<merlin::variable,_std::allocator<merlin::variable>_>::vector(&this->m_source_order);
  std::vector<merlin::variable,_std::allocator<merlin::variable>_>::vector(&this->m_target_order);
  std::vector<merlin::variable,_std::allocator<merlin::variable>_>::operator=
            (&this->m_source_order,order);
  this->m_source_big_endian = source_big_endian;
  this->m_target_big_endian = target_big_endian;
  sVar2 = std::vector<merlin::variable,_std::allocator<merlin::variable>_>::size(order);
  this->m_n = sVar2;
  B = std::vector<merlin::variable,_std::allocator<merlin::variable>_>::begin(order);
  i.m_tmp.m_states =
       (size_t)std::vector<merlin::variable,_std::allocator<merlin::variable>_>::end(order);
  sVar2 = std::vector<merlin::variable,_std::allocator<merlin::variable>_>::size(order);
  variable_set::
  variable_set<__gnu_cxx::__normal_iterator<merlin::variable_const*,std::vector<merlin::variable,std::allocator<merlin::variable>>>>
            ((variable_set *)local_68,
             (__normal_iterator<const_merlin::variable_*,_std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>
              )B._M_current,
             (__normal_iterator<const_merlin::variable_*,_std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>
              )i.m_tmp.m_states,sVar2);
  variable_set::begin((const_iterator *)local_98,(variable_set *)local_68);
  while( true ) {
    variable_set::end(&local_b8,(variable_set *)local_68);
    ci.m_vs = local_b8.m_vs;
    ci.m_i = local_b8.m_i;
    ci.m_tmp.m_label = local_b8.m_tmp.m_label;
    ci.m_tmp.m_states = local_b8.m_tmp.m_states;
    bVar1 = variable_set::const_iterator::operator!=((const_iterator *)local_98,ci);
    if (!bVar1) break;
    vVar3 = variable_set::const_iterator::operator*((const_iterator *)local_98);
    local_c8 = vVar3;
    std::vector<merlin::variable,_std::allocator<merlin::variable>_>::push_back
              (&this->m_target_order,&local_c8);
    variable_set::const_iterator::operator++((const_iterator *)local_98);
  }
  variable_set::~variable_set((variable_set *)local_68);
  return;
}

Assistant:

convert_index(const std::vector<variable>& order, bool source_big_endian = false,
			bool target_big_endian = false) {

		m_source_order = order; // save source variable order
		m_source_big_endian = source_big_endian; // source representation
		m_target_big_endian = target_big_endian; // target representation
		m_n = order.size(); // size of the source/target variable orders

		variable_set _vs = variable_set(order.begin(), order.end(), order.size());
		for (variable_set::const_iterator i = _vs.begin(); i != _vs.end(); ++i) {
			m_target_order.push_back(*i);
		}
	}